

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalBatchCopyToFile::RepartitionBatches
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p,
          idx_t min_index,bool final)

{
  StateWithBlockableTasks *pSVar1;
  idx_t iVar2;
  unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true> __p;
  pointer __p_00;
  undefined4 uVar3;
  ColumnDataCollection *__p_01;
  bool bVar4;
  iterator __position;
  pointer pFVar5;
  pointer pCVar6;
  type this_00;
  DataChunk *input;
  const_reference pvVar7;
  ulong uVar8;
  _Rb_tree_node_base *p_Var9;
  __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  *p_Var10;
  ulong uVar11;
  undefined3 in_register_00000081;
  BatchTaskManager<duckdb::BatchCopyTask> *this_01;
  ulong uVar12;
  _Self __tmp;
  unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
  append_batch;
  templated_unique_single_t new_collection_1;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_268;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_260;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_258;
  pointer local_250;
  PhysicalBatchCopyToFile *local_248;
  undefined4 local_240;
  uint local_23c;
  pthread_mutex_t *local_238;
  GlobalSinkState *local_230;
  BatchTaskManager<duckdb::BatchCopyTask> *local_228;
  ClientContext *local_220;
  idx_t max_batch_index;
  __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  *local_210;
  vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_true>
  raw_batches;
  ColumnDataChunkIterationHelper local_1e8;
  templated_unique_single_t new_collection;
  ColumnDataAppendState append_state;
  ColumnDataChunkIterator __end2;
  
  local_238 = (pthread_mutex_t *)
              &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_248 = this;
  local_220 = context;
  ::std::mutex::lock((mutex *)&local_238->__data);
  if (gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
      __prev == (__pthread_internal_list *)0x0) goto LAB_009d2529;
  if (!final) {
    if ((gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] & 1U)
        != 0) goto LAB_009d2529;
    uVar12 = 0;
    for (p_Var9 = *(_Rb_tree_node_base **)
                   ((long)&gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base.
                           _M_mutex + 8);
        ((StateWithBlockableTasks *)p_Var9 != &gstate_p[5].super_StateWithBlockableTasks &&
        (*(ulong *)(p_Var9 + 1) < min_index));
        p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9)) {
      pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
               ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                             *)&p_Var9[1]._M_parent);
      pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&pFVar5->collection);
      uVar12 = uVar12 + pCVar6->count;
    }
    if (uVar12 < *(ulong *)&gstate_p[4].state) goto LAB_009d2529;
  }
  local_228 = (BatchTaskManager<duckdb::BatchCopyTask> *)
              ((long)&gstate_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
              0x10);
  local_230 = gstate_p + 5;
  max_batch_index = 0;
  raw_batches.
  super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  raw_batches.
  super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  raw_batches.
  super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__position._M_node =
            *(_Base_ptr *)
             ((long)&gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8)
      ; ((StateWithBlockableTasks *)__position._M_node != &gstate_p[5].super_StateWithBlockableTasks
        && (*(ulong *)(__position._M_node + 1) < min_index));
      __position = ::std::
                   _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>>
                                       *)local_230,__position)) {
    max_batch_index = *(ulong *)(__position._M_node + 1);
    ::std::
    vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>,std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>
              ((vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>,std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>
                *)&raw_batches,
               (unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                *)&__position._M_node[1]._M_parent);
  }
  append_batch.
  super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
  .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>)
       (__uniq_ptr_data<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true,_true>
        )0x0;
  append_state.current_chunk_state.handles._M_h._M_buckets =
       &append_state.current_chunk_state.handles._M_h._M_single_bucket;
  append_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  append_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  append_state.current_chunk_state.handles._M_h._M_element_count = 0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  append_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  append_state.current_chunk_state.properties = INVALID;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               *)raw_batches.
                 super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = (PhysicalBatchCopyToFile *)&(local_248->super_PhysicalOperator).children;
  this_01 = local_228;
  local_240 = CONCAT31(in_register_00000081,final);
  for (p_Var10 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                  *)raw_batches.
                    super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; uVar3 = local_240,
      p_Var10 != local_210; p_Var10 = p_Var10 + 1) {
    if (append_batch.
        super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
        .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl ==
        (__uniq_ptr_data<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true,_true>
         )0x0) {
      pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
               ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                             *)p_Var10);
      pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&pFVar5->collection);
      uVar12 = *(ulong *)&gstate_p[4].state;
      if (uVar12 == 0) {
LAB_009d2037:
        LOCK();
        pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
        __end2.collection = *(ColumnDataCollection **)pSVar1;
        *(long *)pSVar1 = *(long *)pSVar1 + 1;
        UNLOCK();
        make_uniq<duckdb::PrepareBatchTask,unsigned_long,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>
                  ((duckdb *)&new_collection,(unsigned_long *)&__end2,
                   (unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                    *)p_Var10);
        local_260._M_head_impl = (ColumnDataCollection *)new_collection;
        new_collection.
        super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              )(__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
                )0x0;
        BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                  (this_01,(unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                            *)&local_260);
        if ((_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)local_260._M_head_impl !=
            (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0) {
          (*(code *)(((local_260._M_head_impl)->allocator).internal.
                     super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->alloc)();
        }
        local_260._M_head_impl = (ColumnDataCollection *)0x0;
        if (new_collection.
            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)new_collection.
                                super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                                .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                                _M_head_impl + 8))();
        }
LAB_009d20b1:
        ::std::
        __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
        ::reset(p_Var10,(pointer)0x0);
      }
      else {
        uVar11 = pCVar6->count - uVar12;
        uVar8 = -uVar11;
        if (0 < (long)uVar11) {
          uVar8 = uVar11;
        }
        if (uVar8 < 0x800) goto LAB_009d2037;
        if (pCVar6->count < uVar12) {
          ::std::
          __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ::operator=((__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                       *)&append_batch,p_Var10);
          goto LAB_009d20b1;
        }
        pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                            local_248,0);
        make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&>
                  ((duckdb *)&new_collection,local_220,&pvVar7->_M_data->types);
        pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)&new_collection);
        ColumnDataCollection::SetPartitionIndex(pCVar6,0);
        local_1e8.collection._0_4_ = 0;
        make_uniq<duckdb::FixedRawBatchData,unsigned_int,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
                  ((duckdb *)&__end2,(uint *)&local_1e8,
                   (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    *)&new_collection);
        __p_01 = __end2.collection;
        __end2.collection = (ColumnDataCollection *)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
        ::reset((__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                 *)&append_batch,(pointer)__p_01);
        ::std::
        unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>::
        ~unique_ptr((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                     *)&__end2);
        ::std::
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                       *)&new_collection);
      }
      if (append_batch.
          super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
          .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true,_true>
           )0x0) {
        pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                 ::operator->(&append_batch);
        pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&pFVar5->collection);
        ColumnDataCollection::InitializeAppend(pCVar6,&append_state);
      }
    }
    if ((p_Var10->_M_t).
        super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
        .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl !=
        (FixedRawBatchData *)0x0) {
      pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
               ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                             *)p_Var10);
      this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator*(&pFVar5->collection);
      pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
               ::operator->((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                             *)p_Var10);
      iVar2 = pFVar5->memory_usage;
      pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
               ::operator->(&append_batch);
      pFVar5->memory_usage = pFVar5->memory_usage + iVar2;
      ColumnDataCollection::Chunks(&local_1e8,this_00);
      ColumnDataChunkIterationHelper::begin((ColumnDataChunkIterator *)&new_collection,&local_1e8);
      this_01 = local_228;
      ColumnDataChunkIterationHelper::end(&__end2,&local_1e8);
      while (bVar4 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               ((ColumnDataChunkIterator *)&new_collection,&__end2), bVar4) {
        input = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                          ((ColumnDataChunkIterator *)&new_collection);
        pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                 ::operator->(&append_batch);
        pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&pFVar5->collection);
        ColumnDataCollection::Append(pCVar6,&append_state,input);
        pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                 ::operator->(&append_batch);
        pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&pFVar5->collection);
        if (*(ulong *)&gstate_p[4].state <= pCVar6->count) {
          LOCK();
          pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
          local_250 = *(pointer *)pSVar1;
          *(long *)pSVar1 = *(long *)pSVar1 + 1;
          UNLOCK();
          make_uniq<duckdb::PrepareBatchTask,unsigned_long,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>
                    ((duckdb *)&new_collection_1,(unsigned_long *)&local_250,&append_batch);
          local_268._M_head_impl = (ColumnDataCollection *)new_collection_1;
          new_collection_1.
          super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
          .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                )(__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
                  )0x0;
          BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                    (this_01,(unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                              *)&local_268);
          if ((_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)local_268._M_head_impl !=
              (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0) {
            (*(code *)(((local_268._M_head_impl)->allocator).internal.
                       super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->alloc)();
          }
          local_268._M_head_impl = (ColumnDataCollection *)0x0;
          if (new_collection_1.
              super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
              .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)new_collection_1.
                                  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                                  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                                  _M_head_impl + 8))();
          }
          pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                             ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                              local_248,0);
          make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&>
                    ((duckdb *)&new_collection_1,local_220,&pvVar7->_M_data->types);
          pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                   ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                 *)&new_collection_1);
          ColumnDataCollection::SetPartitionIndex(pCVar6,0);
          local_23c = 0;
          make_uniq<duckdb::FixedRawBatchData,unsigned_int,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
                    ((duckdb *)&local_250,&local_23c,
                     (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                      *)&new_collection_1);
          __p_00 = local_250;
          local_250 = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
          ::reset((__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                   *)&append_batch,__p_00);
          ::std::
          unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>::
          ~unique_ptr((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                       *)&local_250);
          pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                   ::operator->(&append_batch);
          pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                   ::operator->(&pFVar5->collection);
          ColumnDataCollection::InitializeAppend(pCVar6,&append_state);
          ::std::
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                         *)&new_collection_1);
        }
        ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++
                  ((ColumnDataChunkIterator *)&new_collection);
      }
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
                ((ColumnDataChunkIterator *)&new_collection);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &local_1e8.column_ids);
    }
  }
  if (append_batch.
      super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
      .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true,_true>
       )0x0) {
    pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
             ::operator->(&append_batch);
    pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&pFVar5->collection);
    if (pCVar6->count != 0) {
      if ((char)uVar3 == '\0') {
        pFVar5 = unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
                 ::operator->(&append_batch);
        pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&pFVar5->collection);
        if (*(long *)&gstate_p[4].state != 0) {
          uVar8 = pCVar6->count - *(long *)&gstate_p[4].state;
          uVar12 = -uVar8;
          if (0 < (long)uVar8) {
            uVar12 = uVar8;
          }
          if (0x7ff < uVar12) {
            p_Var10 = (__uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                       *)::std::
                         map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
                         ::operator[]((map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>_>
                                       *)local_230,&max_batch_index);
            __p = append_batch;
            append_batch.
            super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
            .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                  )(__uniq_ptr_data<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true,_true>
                    )0x0;
            ::std::
            __uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
            ::reset(p_Var10,(pointer)__p.
                                     super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
                                     .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>.
                                     _M_head_impl);
            goto LAB_009d2505;
          }
        }
      }
      LOCK();
      pSVar1 = &gstate_p[6].super_StateWithBlockableTasks;
      __end2.collection = *(ColumnDataCollection **)pSVar1;
      *(long *)pSVar1 = *(long *)pSVar1 + 1;
      UNLOCK();
      make_uniq<duckdb::PrepareBatchTask,unsigned_long,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>
                ((duckdb *)&new_collection,(unsigned_long *)&__end2,&append_batch);
      local_258._M_head_impl = (ColumnDataCollection *)new_collection;
      new_collection.
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            )(__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
              )0x0;
      BatchTaskManager<duckdb::BatchCopyTask>::AddTask
                (this_01,(unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                          *)&local_258);
      if ((_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)local_258._M_head_impl !=
          (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0) {
        (*(code *)(((local_258._M_head_impl)->allocator).internal.
                   super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->alloc)();
      }
      local_258._M_head_impl = (ColumnDataCollection *)0x0;
      if (new_collection.
          super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
          .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)new_collection.
                              super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                              .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                              _M_head_impl + 8))();
      }
    }
  }
LAB_009d2505:
  ColumnDataAppendState::~ColumnDataAppendState(&append_state);
  ::std::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>::
  ~unique_ptr(&append_batch.
               super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
             );
  ::std::
  vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
  ::~vector(&raw_batches.
             super_vector<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>
           );
LAB_009d2529:
  pthread_mutex_unlock(local_238);
  return;
}

Assistant:

void PhysicalBatchCopyToFile::RepartitionBatches(ClientContext &context, GlobalSinkState &gstate_p, idx_t min_index,
                                                 bool final) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	auto &task_manager = gstate.task_manager;

	// repartition batches until the min index is reached
	lock_guard<mutex> l(gstate.lock);
	if (gstate.raw_batches.empty()) {
		return;
	}
	if (!final) {
		if (gstate.any_finished) {
			// we only repartition in ::NextBatch if all threads are still busy processing batches
			// otherwise we might end up repartitioning a lot of data with only a few threads remaining
			// which causes erratic performance
			return;
		}
		// if this is not the final flush we first check if we have enough data to merge past the batch threshold
		idx_t candidate_rows = 0;
		for (auto entry = gstate.raw_batches.begin(); entry != gstate.raw_batches.end(); entry++) {
			if (entry->first >= min_index) {
				// we have exceeded the minimum batch
				break;
			}
			candidate_rows += entry->second->collection->Count();
		}
		if (candidate_rows < gstate.batch_size) {
			// not enough rows - cancel!
			return;
		}
	}
	// gather all collections we can repartition
	idx_t max_batch_index = 0;
	vector<unique_ptr<FixedRawBatchData>> raw_batches;
	for (auto entry = gstate.raw_batches.begin(); entry != gstate.raw_batches.end();) {
		if (entry->first >= min_index) {
			break;
		}
		max_batch_index = entry->first;
		raw_batches.push_back(std::move(entry->second));
		entry = gstate.raw_batches.erase(entry);
	}
	unique_ptr<FixedRawBatchData> append_batch;
	ColumnDataAppendState append_state;
	// now perform the actual repartitioning
	for (auto &current_batch : raw_batches) {
		if (!append_batch) {
			auto current_count = current_batch->collection->Count();
			if (CorrectSizeForBatch(current_count, gstate.batch_size)) {
				// the collection is ~approximately equal to the batch size (off by at most one vector)
				// use it directly
				task_manager.AddTask(
				    make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(current_batch)));
				current_batch.reset();
			} else if (current_count < gstate.batch_size) {
				// the collection is smaller than the batch size - use it as a starting point
				append_batch = std::move(current_batch);
				current_batch.reset();
			} else {
				// the collection is too large for a batch - we need to repartition
				// create an empty collection
				auto new_collection = make_uniq<ColumnDataCollection>(context, children[0].get().GetTypes());
				new_collection->SetPartitionIndex(0); // Makes the buffer manager less likely to spill this data
				append_batch = make_uniq<FixedRawBatchData>(0U, std::move(new_collection));
			}
			if (append_batch) {
				append_batch->collection->InitializeAppend(append_state);
			}
		}
		if (!current_batch) {
			// we have consumed the collection already - no need to append
			continue;
		}
		auto &current_collection = *current_batch->collection;
		append_batch->memory_usage += current_batch->memory_usage;
		// iterate the collection while appending
		for (auto &chunk : current_collection.Chunks()) {
			// append the chunk to the collection
			append_batch->collection->Append(append_state, chunk);
			if (append_batch->collection->Count() < gstate.batch_size) {
				// the collection is still under the batch size - continue
				continue;
			}
			// the collection is full - move it to the result and create a new one
			task_manager.AddTask(make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(append_batch)));

			auto new_collection = make_uniq<ColumnDataCollection>(context, children[0].get().GetTypes());
			new_collection->SetPartitionIndex(0); // Makes the buffer manager less likely to spill this data
			append_batch = make_uniq<FixedRawBatchData>(0U, std::move(new_collection));
			append_batch->collection->InitializeAppend(append_state);
		}
	}
	if (append_batch && append_batch->collection->Count() > 0) {
		// if there are any remaining batches that are not filled up to the batch size
		// AND this is not the final collection
		// re-add it to the set of raw (to-be-merged) batches
		if (final || CorrectSizeForBatch(append_batch->collection->Count(), gstate.batch_size)) {
			task_manager.AddTask(make_uniq<PrepareBatchTask>(gstate.scheduled_batch_index++, std::move(append_batch)));
		} else {
			gstate.raw_batches[max_batch_index] = std::move(append_batch);
		}
	}
}